

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O0

void __thiscall
RegVmLoweredFunction::GetRegisters
          (RegVmLoweredFunction *this,SmallArray<unsigned_char,_32U> *result,VmValue *value)

{
  bool bVar1;
  uint uVar2;
  VmInstruction *pVVar3;
  uchar *val;
  uint local_2c;
  uint i;
  VmInstruction *instruction;
  VmValue *value_local;
  SmallArray<unsigned_char,_32U> *result_local;
  RegVmLoweredFunction *this_local;
  
  pVVar3 = getType<VmInstruction>(value);
  CompleteUse(this,value);
  bVar1 = SmallArray<unsigned_char,_8U>::empty(&pVVar3->regVmRegisters);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!instruction->regVmRegisters.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                  ,0xa4,
                  "void RegVmLoweredFunction::GetRegisters(SmallArray<unsigned char, 32> &, VmValue *)"
                 );
  }
  local_2c = 0;
  while( true ) {
    uVar2 = SmallArray<unsigned_char,_8U>::size(&pVVar3->regVmRegisters);
    if (uVar2 <= local_2c) break;
    val = SmallArray<unsigned_char,_8U>::operator[](&pVVar3->regVmRegisters,local_2c);
    SmallArray<unsigned_char,_32U>::push_back(result,val);
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void RegVmLoweredFunction::GetRegisters(SmallArray<unsigned char, 32> &result, VmValue *value)
{
	VmInstruction *instruction = getType<VmInstruction>(value);

	CompleteUse(value);

	assert(!instruction->regVmRegisters.empty());

	for(unsigned i = 0; i < instruction->regVmRegisters.size(); i++)
		result.push_back(instruction->regVmRegisters[i]);
}